

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

size_t __thiscall nuraft::raft_server::get_not_responding_peers(raft_server *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  __int_type_conflict2 _Var4;
  element_type *peVar5;
  context *in_RDI;
  int32 resp_elapsed_ms;
  ptr<peer> p;
  pair<const_int,_std::shared_ptr<nuraft::peer>_> *entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *__range1;
  int expiry;
  ptr<raft_params> params;
  size_t num_not_resp_nodes;
  unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
  *in_stack_ffffffffffffff68;
  shared_ptr<nuraft::peer> *in_stack_ffffffffffffff70;
  __atomic_base<int> *in_stack_ffffffffffffff78;
  raft_server *this_00;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_40;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false> local_38;
  EventAwaiter *local_30;
  __atomic_base<int> local_24;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_10;
  
  local_10.__d.__r = (duration)0;
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x275174);
  nuraft::context::get_params(in_RDI);
  peVar5 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x27518b);
  iVar1 = *(int *)(peVar5 + 8);
  _Var4 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff78);
  local_24._M_i = iVar1 * _Var4;
  local_30 = (EventAwaiter *)(in_RDI + 0x1e0);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::begin(in_stack_ffffffffffffff68);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_std::shared_ptr<nuraft::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>_>
       ::end(in_stack_ffffffffffffff68);
  while (bVar3 = std::__detail::operator!=(&stack0xffffffffffffffc8,&stack0xffffffffffffffc0), bVar3
        ) {
    local_48._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::__detail::
         _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::
         operator*((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>
                    *)0x2751ff);
    this_00 = (raft_server *)&stack0xffffffffffffffa8;
    std::shared_ptr<nuraft::peer>::shared_ptr
              (in_stack_ffffffffffffff70,(shared_ptr<nuraft::peer> *)in_stack_ffffffffffffff68);
    bVar3 = is_regular_member(this_00,in_stack_ffffffffffffff70);
    if (bVar3) {
      std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x275276);
      in_stack_ffffffffffffff70 =
           (shared_ptr<nuraft::peer> *)peer::get_resp_timer_us((peer *)0x27527e);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_stack_ffffffffffffff70;
      if (local_24._M_i < SUB164(auVar2 / ZEXT816(1000),0)) {
        local_10.__d.__r = (duration)((long)local_10.__d.__r + 1);
      }
    }
    std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x2752c8);
    std::__detail::
    _Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false>::operator++
              ((_Node_iterator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false,_false> *
               )in_stack_ffffffffffffff70);
  }
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x275303);
  return (size_t)local_10.__d.__r;
}

Assistant:

size_t raft_server::get_not_responding_peers() {
    // Check if quorum nodes are not responding
    // (i.e., don't respond 20x heartbeat time long).
    size_t num_not_resp_nodes = 0;

    ptr<raft_params> params = ctx_->get_params();
    int expiry = params->heart_beat_interval_ *
                     raft_server::raft_limits_.response_limit_;

    // Check the number of not responding peers.
    for (auto& entry: peers_) {
        ptr<peer> p = entry.second;

        if (!is_regular_member(p)) continue;

        int32 resp_elapsed_ms = (int32)(p->get_resp_timer_us() / 1000);
        if ( resp_elapsed_ms > expiry ) {
            num_not_resp_nodes++;
        }
    }
    return num_not_resp_nodes;
}